

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

void little2_updatePosition(ENCODING *enc,char *ptr,char *end,POSITION *pos)

{
  long lVar1;
  byte *pbVar2;
  
  lVar1 = -(long)ptr;
  do {
    if ((long)(end + lVar1) < 2) {
      return;
    }
    if (((byte *)ptr)[1] - 0xd8 < 4) {
switchD_0017a19e_caseD_7:
      pbVar2 = (byte *)ptr + 4;
LAB_0017a1a5:
      pos->columnNumber = pos->columnNumber + 1;
    }
    else {
      if (((byte *)ptr)[1] != 0) {
switchD_0017a19e_caseD_5:
        pbVar2 = (byte *)ptr + 2;
        goto LAB_0017a1a5;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
      default:
        goto switchD_0017a19e_caseD_5;
      case 6:
        pbVar2 = (byte *)ptr + 3;
        goto LAB_0017a1a5;
      case 7:
        goto switchD_0017a19e_caseD_7;
      case 9:
        pos->lineNumber = pos->lineNumber + 1;
        pbVar2 = (byte *)ptr + 2;
        if (((1 < (long)end - (long)pbVar2) && (((byte *)ptr)[3] == 0)) &&
           (*(char *)((long)enc[1].scanners + (ulong)((byte *)ptr)[2]) == '\n')) {
          pbVar2 = (byte *)ptr + 4;
        }
        pos->columnNumber = 0;
        break;
      case 10:
        pos->columnNumber = 0;
        pos->lineNumber = pos->lineNumber + 1;
        pbVar2 = (byte *)ptr + 2;
      }
    }
    lVar1 = -(long)pbVar2;
    ptr = (char *)pbVar2;
  } while( true );
}

Assistant:

static void PTRCALL
PREFIX(updatePosition)(const ENCODING *enc, const char *ptr, const char *end,
                       POSITION *pos) {
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    ptr += n; /* NOTE: The encoding has already been validated. */             \
    pos->columnNumber++;                                                       \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_LF:
      pos->columnNumber = 0;
      pos->lineNumber++;
      ptr += MINBPC(enc);
      break;
    case BT_CR:
      pos->lineNumber++;
      ptr += MINBPC(enc);
      if (HAS_CHAR(enc, ptr, end) && BYTE_TYPE(enc, ptr) == BT_LF)
        ptr += MINBPC(enc);
      pos->columnNumber = 0;
      break;
    default:
      ptr += MINBPC(enc);
      pos->columnNumber++;
      break;
    }
  }
}